

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O1

void __thiscall unitOps_inequality1_Test::TestBody(unitOps_inequality1_Test *this)

{
  bool bVar1;
  char *pcVar2;
  double dVar3;
  double dVar4;
  unit u2;
  unit u3;
  unit u1;
  int eqFailNeg;
  int eqFailPos;
  unit local_60;
  unit local_58;
  unit local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  int local_3c;
  int local_38;
  float local_34;
  double local_30;
  double local_28;
  
  local_38 = 0;
  local_3c = 0;
  dVar3 = 1.0;
  do {
    local_34 = (float)dVar3;
    dVar4 = 1e-05;
    local_30 = dVar3;
    do {
      local_50.multiplier_ = local_34;
      local_50.base_units_ = (unit_data)0x39d2;
      local_60.multiplier_ = (float)(local_30 + dVar4);
      local_60.base_units_ = (unit_data)0x39d2;
      local_58.multiplier_ = (float)(local_30 - dVar4);
      local_58.base_units_ = (unit_data)0x39d2;
      local_28 = dVar4;
      bVar1 = units::unit::operator==(&local_50,&local_60);
      if (bVar1) {
        local_38 = local_38 + 1;
      }
      bVar1 = units::unit::operator==(&local_50,&local_58);
      if (bVar1) {
        local_3c = local_3c + 1;
      }
      dVar4 = local_28 + -1e-08;
    } while (2.501e-06 < dVar4);
    dVar3 = local_30 + 1e-09;
  } while (dVar3 < 1.000002);
  local_60.multiplier_ = 0.0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_50,"eqFailPos","0",&local_38,(int *)&local_60);
  if (local_50.multiplier_._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_60);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x1a6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if ((long *)CONCAT44(local_60.base_units_,local_60.multiplier_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_60.base_units_,local_60.multiplier_) + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  local_60.multiplier_ = 0.0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_50,"eqFailNeg","0",&local_3c,(int *)&local_60);
  if (local_50.multiplier_._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_60);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x1a7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if ((long *)CONCAT44(local_60.base_units_,local_60.multiplier_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_60.base_units_,local_60.multiplier_) + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  return;
}

Assistant:

TEST(unitOps, inequality1)
{
    int eqFailPos = 0;
    int eqFailNeg = 0;
    double start = 1.0;
    while (start < (1.0 + 2e-6)) {
        double diff = 1e-5;
        while (diff > 2.501e-6) {
            auto u1 = unit(start, V);
            auto u2 = unit(start + diff, V);
            auto u3 = unit(start - diff, V);
            if (u1 == u2) {
                ++eqFailPos;
            }
            if (u1 == u3) {
                ++eqFailNeg;
            }
            diff -= 1e-8;
        }
        start += 1e-9;
    }
    EXPECT_EQ(eqFailPos, 0);
    EXPECT_EQ(eqFailNeg, 0);
}